

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3JsonTableFunctions(sqlite3 *db)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = true;
  lVar2 = 0;
  do {
    iVar1 = createModule(db,sqlite3JsonTableFunctions::aMod[lVar2].zName,
                         sqlite3JsonTableFunctions::aMod[lVar2].pModule,(void *)0x0,
                         (_func_void_void_ptr *)0x0);
    if (!bVar3) {
      return iVar1;
    }
    lVar2 = 1;
    bVar3 = false;
  } while (iVar1 == 0);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3JsonTableFunctions(sqlite3 *db){
  int rc = SQLITE_OK;
  static const struct {
    const char *zName;
    sqlite3_module *pModule;
  } aMod[] = {
    { "json_each",            &jsonEachModule               },
    { "json_tree",            &jsonTreeModule               },
  };
  unsigned int i;
  for(i=0; i<sizeof(aMod)/sizeof(aMod[0]) && rc==SQLITE_OK; i++){
    rc = sqlite3_create_module(db, aMod[i].zName, aMod[i].pModule, 0);
  }
  return rc;
}